

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iothub_registrymanager.c
# Opt level: O1

void IoTHubRegistryManager_Destroy(IOTHUB_REGISTRYMANAGER_HANDLE registryManagerHandle)

{
  if (registryManagerHandle != (IOTHUB_REGISTRYMANAGER_HANDLE)0x0) {
    free(registryManagerHandle->hostname);
    free(registryManagerHandle->iothubName);
    free(registryManagerHandle->iothubSuffix);
    free(registryManagerHandle->sharedAccessKey);
    free(registryManagerHandle->keyName);
    free(registryManagerHandle->deviceId);
    free(registryManagerHandle);
    return;
  }
  return;
}

Assistant:

void IoTHubRegistryManager_Destroy(IOTHUB_REGISTRYMANAGER_HANDLE registryManagerHandle)
{
    if (registryManagerHandle != NULL)
    {
        IOTHUB_REGISTRYMANAGER* regManHandle = (IOTHUB_REGISTRYMANAGER*)registryManagerHandle;

        free(regManHandle->hostname);
        free(regManHandle->iothubName);
        free(regManHandle->iothubSuffix);
        free(regManHandle->sharedAccessKey);
        free(regManHandle->keyName);
        free(regManHandle->deviceId);
        free(regManHandle);
    }
}